

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int av1_get_mvpred_sse(MV_COST_PARAMS *mv_cost_params,FULLPEL_MV best_mv,aom_variance_fn_ptr_t *vfp,
                      buf_2d *src,buf_2d *pre)

{
  undefined4 uVar1;
  code *pcVar2;
  int iVar3;
  uint8_t *puVar4;
  undefined8 *in_RCX;
  long in_RDX;
  long in_R8;
  uint var;
  uint sse;
  MV mv;
  MV *in_stack_ffffffffffffffa8;
  buf_2d *buf;
  int local_30;
  MV local_2c;
  long local_28;
  undefined8 *local_20;
  long local_18;
  FULLPEL_MV local_4;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_2c = get_mv_from_fullmv(&local_4);
  pcVar2 = *(code **)(local_18 + 0x18);
  buf = (buf_2d *)*local_20;
  uVar1 = *(undefined4 *)(local_20 + 3);
  puVar4 = get_buf_from_fullmv(buf,(FULLPEL_MV *)in_stack_ffffffffffffffa8);
  (*pcVar2)(buf,uVar1,puVar4,*(undefined4 *)(local_28 + 0x18),&local_30);
  iVar3 = mv_err_cost_(in_stack_ffffffffffffffa8,(MV_COST_PARAMS *)0x265a4b);
  return local_30 + iVar3;
}

Assistant:

int av1_get_mvpred_sse(const MV_COST_PARAMS *mv_cost_params,
                       const FULLPEL_MV best_mv,
                       const aom_variance_fn_ptr_t *vfp,
                       const struct buf_2d *src, const struct buf_2d *pre) {
  const MV mv = get_mv_from_fullmv(&best_mv);
  unsigned int sse, var;

  var = vfp->vf(src->buf, src->stride, get_buf_from_fullmv(pre, &best_mv),
                pre->stride, &sse);
  (void)var;

  return sse + mv_err_cost_(&mv, mv_cost_params);
}